

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

region_conflict region_calculate(region_conflict loc)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  region_conflict rVar4;
  wchar_t h;
  wchar_t w;
  uint local_30;
  uint local_2c;
  
  Term_get_size((int *)&local_2c,(int *)&local_30);
  rVar4.col = (loc.col >> 0x1f & local_2c) + loc.col;
  iVar2 = (loc.row >> 0x1f & local_30) + loc.row;
  uVar1 = loc._8_8_ & 0xffffffff00000000 | (ulong)(uint)((local_2c + loc.width) - rVar4.col);
  if (L'\0' < loc.width) {
    uVar1 = loc._8_8_;
  }
  iVar3 = (int)(uVar1 >> 0x20);
  if (iVar3 < 1) {
    uVar1 = uVar1 & 0xffffffff | (ulong)((local_30 - iVar2) + iVar3) << 0x20;
  }
  rVar4.row = iVar2;
  rVar4.width = (int)uVar1;
  rVar4.page_rows = (int)(uVar1 >> 0x20);
  return rVar4;
}

Assistant:

region region_calculate(region loc)
{
	int w, h;
	Term_get_size(&w, &h);

	if (loc.col < 0)
		loc.col += w;
	if (loc.row < 0)
		loc.row += h;
	if (loc.width <= 0)
		loc.width += w - loc.col;
	if (loc.page_rows <= 0)
		loc.page_rows += h - loc.row;

	return loc;
}